

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_maps.hpp
# Opt level: O3

void __thiscall PatchOptimizeMaps::alter_world(PatchOptimizeMaps *this,World *world)

{
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this_00;
  undefined8 in_RAX;
  mapped_type *ppMVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  clear_unreachable_maps(world);
  remove_useless_entities(world);
  optimize_palettes_usage(world);
  optimize_map_connections(world);
  uStack_18._0_4_ = CONCAT22(0x36,(undefined2)uStack_18);
  this_00 = &world->_maps;
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,(key_type *)((long)&uStack_18 + 2));
  transform_variant_into_standard(*ppMVar1);
  uStack_18._0_6_ = CONCAT24(0x270,(undefined4)uStack_18);
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,(key_type *)((long)&uStack_18 + 4));
  transform_variant_into_standard(*ppMVar1);
  uStack_18 = CONCAT26(0x2be,(undefined6)uStack_18);
  ppMVar1 = std::
            map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
            ::at(this_00,(key_type *)((long)&uStack_18 + 6));
  transform_variant_into_standard(*ppMVar1);
  remove_useless_map_variants(world);
  return;
}

Assistant:

void alter_world(World& world) override
    {
        clear_unreachable_maps(world);
        remove_useless_entities(world);
        optimize_palettes_usage(world);
        optimize_map_connections(world);

        transform_variant_into_standard(world.map(MAP_MERCATOR_CASTLE_THRONE_ROOM_ARTHUR_VARIANT));
        transform_variant_into_standard(world.map(MAP_RYUMA_INN_VARIANT));
        transform_variant_into_standard(world.map(MAP_MERCATOR_HOTEL_VARIANT));

        remove_useless_map_variants(world);
    }